

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O2

double __thiscall
chrono::utils::ChISO2631_Shock_SeatCushionLogger::GetSe(ChISO2631_Shock_SeatCushionLogger *this)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  size_t i_1;
  vector<double,_std::allocator<double>_> *this_03;
  ChISO2631_Shock_SeatCushionLogger *this_04;
  size_t i;
  size_type sVar1;
  size_type __new_size;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 in_ZMM1 [64];
  
  auVar5._0_8_ = this->m_logging_time / this->m_step;
  auVar5._8_8_ = 0;
  auVar5 = vroundsd_avx(auVar5,auVar5,9);
  __new_size = vcvttsd2usi_avx512f(auVar5);
  if (__new_size != 0) {
    this_03 = &this->m_inp_x;
    std::vector<double,_std::allocator<double>_>::resize(this_03,__new_size);
    this_00 = &this->m_inp_y;
    std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size);
    this_01 = &this->m_inp_z;
    std::vector<double,_std::allocator<double>_>::resize(this_01,__new_size);
    for (sVar1 = 0; __new_size != sVar1; sVar1 = sVar1 + 1) {
      auVar5 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,sVar1);
      dVar3 = auVar5._0_8_ * this->m_step;
      dVar2 = ChFunction_Recorder::Get_y(&this->m_raw_inp_x,dVar3);
      (this->m_inp_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[sVar1] = dVar2;
      dVar2 = ChFunction_Recorder::Get_y(&this->m_raw_inp_y,dVar3);
      (this->m_inp_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[sVar1] = dVar2;
      dVar3 = ChFunction_Recorder::Get_y(&this->m_raw_inp_z,dVar3);
      (this->m_inp_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[sVar1] = dVar3;
    }
    std::vector<double,_std::allocator<double>_>::resize(&this->m_out_x,__new_size);
    std::vector<double,_std::allocator<double>_>::resize(&this->m_out_y,__new_size);
    this_02 = &this->m_out_z;
    this_04 = (ChISO2631_Shock_SeatCushionLogger *)this_02;
    std::vector<double,_std::allocator<double>_>::resize(this_02,__new_size);
    for (sVar1 = 0; __new_size != sVar1; sVar1 = sVar1 + 1) {
      dVar3 = ChISO2631_5_Wxy::Filter
                        (&this->m_weighting_x,
                         (this_03->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[sVar1]);
      (this->m_out_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[sVar1] = dVar3;
      this_04 = (ChISO2631_Shock_SeatCushionLogger *)&this->m_weighting_y;
      dVar3 = ChISO2631_5_Wxy::Filter
                        (&this->m_weighting_y,
                         (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[sVar1]);
      (this->m_out_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[sVar1] = dVar3;
    }
    ChISO2631_5_Wz::Filter((ChISO2631_5_Wz *)this_04,this_01,this_02);
    dVar3 = CalcPeaks(this_04,this_03,false);
    this->m_dkx = dVar3;
    dVar3 = CalcPeaks(this_04,this_00,false);
    this->m_dky = dVar3;
    dVar3 = CalcPeaks(this_04,this_01,true);
    this->m_dkz = dVar3;
    dVar3 = pow(this->m_mx * this->m_dkx,6.0);
    dVar2 = pow(this->m_my * this->m_dky,6.0);
    dVar4 = pow(this->m_mz * this->m_dkz,6.0);
    dVar3 = pow(dVar4 + dVar2 + dVar3,0.16666666666666666);
    return dVar3;
  }
  return 0.0;
}

Assistant:

double ChISO2631_Shock_SeatCushionLogger::GetSe() {
    // generate filter input with fs = 160 Hz
    size_t nInDat = static_cast<size_t>(std::floor(m_logging_time / m_step));

    // Return now if no data available (else, CalcPeaks makes out-of-range accesses).
    if (nInDat == 0)
        return 0;

    m_inp_x.resize(nInDat);
    m_inp_y.resize(nInDat);
    m_inp_z.resize(nInDat);

    for (size_t i = 0; i < nInDat; i++) {
        double t = m_step * i;
        m_inp_x[i] = m_raw_inp_x.Get_y(t);
        m_inp_y[i] = m_raw_inp_y.Get_y(t);
        m_inp_z[i] = m_raw_inp_z.Get_y(t);
    }

    m_out_x.resize(nInDat);
    m_out_y.resize(nInDat);
    m_out_z.resize(nInDat);

    for (size_t i = 0; i < nInDat; i++) {
        m_out_x[i] = m_weighting_x.Filter(m_inp_x[i]);
        m_out_y[i] = m_weighting_y.Filter(m_inp_y[i]);
    }

    m_weighting_z.Filter(m_inp_z, m_out_z);

    m_dkx = CalcPeaks(m_inp_x, false);
    m_dky = CalcPeaks(m_inp_y, false);
    m_dkz = CalcPeaks(m_inp_z, true);

    return pow(pow(m_mx * m_dkx, 6.0) + pow(m_my * m_dky, 6.0) + pow(m_mz * m_dkz, 6.0), 1.0 / 6.0);
}